

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool __thiscall JetHead::Path::normalize(Path *this)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  uint i_1;
  uint i;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> parts2;
  
  parts.mAllocated = 0x20;
  parts.mData = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new__(0x400);
  parts.mSize = 0;
  parts2.mAllocated = 0x20;
  parts2.mData = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 operator_new__(0x400);
  parts2.mSize = 0;
  split<std::__cxx11::string>(&this->mPath,"/",&parts);
  bVar2 = true;
  lVar4 = 0;
  uVar5 = 0;
  do {
    if (parts.mSize <= uVar5) {
      pcVar1 = (this->mPath)._M_dataplus._M_p;
      if (*pcVar1 == '/') {
        std::__cxx11::string::assign((ulong)this,'\x01');
      }
      else {
        (this->mPath)._M_string_length = 0;
        *pcVar1 = '\0';
      }
      for (uVar5 = 0; uVar5 < parts2.mSize - 1; uVar5 = uVar5 + 1) {
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::append((ulong)this,'\x01');
      }
      std::__cxx11::string::append((string *)this);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~vector(&parts2);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~vector(&parts);
      return true;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((parts.mData)->_M_dataplus)._M_p + lVar4),"..");
    if (bVar3) {
      if (bVar2) {
        bVar2 = true;
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        push_back(&parts2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&((parts.mData)->_M_dataplus)._M_p + lVar4));
      }
      else {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        erase(&parts2,parts2.mSize - 1);
LAB_0011b756:
        bVar2 = false;
      }
    }
    else {
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&((parts.mData)->_M_dataplus)._M_p + lVar4),".");
      if (bVar3) {
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((parts.mData)->_M_dataplus)._M_p + lVar4),"");
        if (bVar3) {
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          push_back(&parts2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((parts.mData)->_M_dataplus)._M_p + lVar4));
          goto LAB_0011b756;
        }
      }
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x20;
  } while( true );
}

Assistant:

bool	Path::normalize()
{
	JetHead::vector<JHSTD::string> parts;
	JetHead::vector<JHSTD::string> parts2;
	JetHead::split( mPath, "/", parts );
	bool start = true;
	
	for ( unsigned i = 0; i < parts.size(); i++ )
	{
		if ( parts[ i ] == ".." )
		{
			if ( !start )
				parts2.erase( parts2.size() - 1	);
			else
				parts2.push_back( parts[ i ] );
		}
		else if ( parts[ i ] != "." && parts[ i ] != "" )
		{
			start = false;
			parts2.push_back( parts[ i ] );
		}
	}
		
	if ( isRelative() == false )
		mPath.assign( 1, PATH_SEPERATOR );
	else
		mPath.clear();
	
	for ( unsigned i = 0; i < parts2.size() - 1; i++ )
	{
		mPath.append( parts2[ i ] );
		mPath.append( 1, PATH_SEPERATOR );
	}

	mPath.append( parts2[ parts2.size() - 1 ] );
	
	return true;
}